

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txin_txinreference.cpp
# Opt level: O2

void __thiscall TxIn_Constractor_Test::TestBody(TxIn_Constractor_Test *this)

{
  char *pcVar1;
  string local_120;
  AssertionResult gtest_ar_2;
  string local_f0;
  AssertionResult gtest_ar;
  TxIn txin;
  
  cfd::core::TxIn::TxIn((TxIn *)&txin.super_AbstractTxIn,&exp_txid,0,0xffffffff);
  local_120._M_dataplus._M_p._0_4_ = cfd::core::AbstractTxIn::GetVout(&txin.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetVout()","exp_index",(uint *)&local_120,&exp_index);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_120);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x22,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_120._M_dataplus._M_p._0_4_ = cfd::core::AbstractTxIn::GetSequence(&txin.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetSequence()","exp_sequence",(uint *)&local_120,
             &exp_sequence);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_120);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x23,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTxIn::GetTxid((Txid *)&local_120,&txin.super_AbstractTxIn);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar,(Txid *)&local_120);
  pcVar1 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_f0,&exp_txid);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             pcVar1,local_f0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&local_120);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x24,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::AbstractTxIn::~AbstractTxIn(&txin.super_AbstractTxIn);
  cfd::core::TxIn::TxIn((TxIn *)&txin.super_AbstractTxIn,&exp_txid,0,0xffffffff,&exp_script);
  local_120._M_dataplus._M_p._0_4_ = cfd::core::AbstractTxIn::GetVout(&txin.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetVout()","exp_index",(uint *)&local_120,&exp_index);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_120);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x29,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_120._M_dataplus._M_p._0_4_ = cfd::core::AbstractTxIn::GetSequence(&txin.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetSequence()","exp_sequence",(uint *)&local_120,
             &exp_sequence);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_120);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x2a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTxIn::GetTxid((Txid *)&local_120,&txin.super_AbstractTxIn);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar,(Txid *)&local_120);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_f0,&exp_txid);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),local_f0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&local_120);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x2b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::AbstractTxIn::GetUnlockingScript((Script *)&gtest_ar,&txin.super_AbstractTxIn);
  cfd::core::Script::GetHex_abi_cxx11_(&local_120,(Script *)&gtest_ar);
  pcVar1 = (char *)CONCAT44(local_120._M_dataplus._M_p._4_4_,(uint32_t)local_120._M_dataplus._M_p);
  cfd::core::Script::GetHex_abi_cxx11_(&local_f0,&exp_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar1,local_f0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_120);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x2d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::AbstractTxIn::~AbstractTxIn(&txin.super_AbstractTxIn);
  return;
}

Assistant:

TEST(TxIn, Constractor) {
  {
    TxIn txin(exp_txid, exp_index, exp_sequence);
    EXPECT_EQ(txin.GetVout(), exp_index);
    EXPECT_EQ(txin.GetSequence(), exp_sequence);
    EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  }

  {
    TxIn txin(exp_txid, exp_index, exp_sequence, exp_script);
    EXPECT_EQ(txin.GetVout(), exp_index);
    EXPECT_EQ(txin.GetSequence(), exp_sequence);
    EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
    EXPECT_STREQ(txin.GetUnlockingScript().GetHex().c_str(),
                 exp_script.GetHex().c_str());
  }
}